

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execCmp<(moira::Instr)37,(moira::Mode)0,(moira::Size)1>(Moira *this,u16 opcode)

{
  cmp<(moira::Size)1>(this,(uint)*(byte *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58),
                      (uint)*(byte *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58));
  prefetch<4ul>(this);
  return;
}

Assistant:

void
Moira::execCmp(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    cmp<S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(2);
}